

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

int __thiscall
ON_ModelComponent::CompareName(ON_ModelComponent *this,ON_UUID *other_parent_id,wchar_t *other_name)

{
  bool bVar1;
  wchar_t *name1;
  int local_60;
  int local_5c;
  undefined1 local_38 [20];
  int rc;
  wchar_t *other_name_local;
  ON_UUID *other_parent_id_local;
  ON_ModelComponent *this_local;
  
  unique0x100000b5 = other_name;
  other_name_local = (wchar_t *)other_parent_id;
  other_parent_id_local = (ON_UUID *)this;
  bVar1 = UniqueNameIncludesParent(this->m_component_type);
  if ((bVar1) && (bVar1 = NameIsSet(this), bVar1)) {
    local_5c = ON_UuidCompare(&this->m_component_parent_id,(ON_UUID *)other_name_local);
  }
  else {
    local_5c = 0;
  }
  local_38._12_4_ = local_5c;
  if (local_5c == 0) {
    Name((ON_ModelComponent *)local_38);
    name1 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_38);
    local_60 = ON_wString::CompareAttributeName(name1,stack0xffffffffffffffd8);
  }
  else {
    local_60 = local_5c;
  }
  this_local._4_4_ = local_60;
  if (local_5c == 0) {
    ON_wString::~ON_wString((ON_wString *)local_38);
  }
  return this_local._4_4_;
}

Assistant:

int ON_ModelComponent::CompareName(
  const ON_UUID& other_parent_id,
  const wchar_t* other_name
  ) const
{
  int rc
    = (ON_ModelComponent::UniqueNameIncludesParent(m_component_type) && NameIsSet())
    ? ON_UuidCompare(m_component_parent_id, other_parent_id)
    : 0;
  return
    (0 != rc)
    ? rc
    : ON_wString::CompareAttributeName(Name(), other_name);
}